

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall libtorrent::aux::socks5::socks_forward_udp(socks5 *this)

{
  undefined8 uVar1;
  bool bVar2;
  pointer data;
  pointer pvVar3;
  unsigned_long size_in_bytes;
  int val;
  undefined1 local_88 [64];
  mutable_buffer local_48;
  undefined1 local_34 [8];
  endpoint local_ep;
  char *p;
  socks5 *this_local;
  
  local_ep.impl_.data_._20_8_ = ::std::array<char,_270UL>::data(&this->m_tmp_buf);
  write_uint8<int,char*>(5,(char **)((long)&local_ep.impl_.data_ + 0x14));
  write_uint8<int,char*>(3,(char **)((long)&local_ep.impl_.data_ + 0x14));
  write_uint8<int,char*>(0,(char **)((long)&local_ep.impl_.data_ + 0x14));
  if ((this->m_send_local_ep & 1U) == 0) {
    write_uint8<int,char*>(1,(char **)((long)&local_ep.impl_.data_ + 0x14));
    write_uint32<int,char*>(0,(char **)((long)&local_ep.impl_.data_ + 0x14));
    write_uint16<int,char*>(0,(char **)((long)&local_ep.impl_.data_ + 0x14));
  }
  else {
    listen_socket_handle::get_local_endpoint((endpoint *)local_34,&this->m_listen_socket);
    bVar2 = is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                      ((basic_endpoint<boost::asio::ip::tcp> *)local_34);
    val = 4;
    if (bVar2) {
      val = 1;
    }
    write_uint8<int,char*>(val,(char **)((long)&local_ep.impl_.data_ + 0x14));
    write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char*&>
              ((basic_endpoint<boost::asio::ip::tcp> *)local_34,
               (char **)((long)&local_ep.impl_.data_ + 0x14));
  }
  data = ::std::array<char,_270UL>::data(&this->m_tmp_buf);
  uVar1 = local_ep.impl_.data_._20_8_;
  pvVar3 = ::std::array<char,_270UL>::data(&this->m_tmp_buf);
  size_in_bytes = numeric_cast<unsigned_long,long,void>(uVar1 - (long)pvVar3);
  local_48 = boost::asio::buffer(data,size_in_bytes);
  local_88._16_8_ = connect1;
  local_88._24_4_ = 0;
  local_88[0x1c] = '\0';
  local_88._29_3_ = 0;
  self((socks5 *)local_88);
  ::std::
  bind<void(libtorrent::aux::socks5::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>const&>
            ((type *)(local_88 + 0x20),(offset_in_socks5_to_subr *)(local_88 + 0x10),
             (shared_ptr<libtorrent::aux::socks5> *)local_88,
             (_Placeholder<1> *)&::std::placeholders::_1);
  boost::asio::
  async_write<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::mutable_buffer,std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
            (&this->m_socks5_sock,&local_48,
             (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
              *)(local_88 + 0x20),(type *)0x0);
  ::std::
  _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  ::~_Bind((_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
            *)(local_88 + 0x20));
  ::std::shared_ptr<libtorrent::aux::socks5>::~shared_ptr
            ((shared_ptr<libtorrent::aux::socks5> *)local_88);
  return;
}

Assistant:

void socks5::socks_forward_udp()
{
	using namespace libtorrent::aux;

	// send SOCKS5 UDP command
	char* p = m_tmp_buf.data();
	write_uint8(5, p); // SOCKS VERSION 5
	write_uint8(3, p); // UDP ASSOCIATE command
	write_uint8(0, p); // reserved

	if (m_send_local_ep)
	{
		auto const local_ep = m_listen_socket.get_local_endpoint();
		write_uint8(aux::is_v4(local_ep) ? 1 : 4, p); // atyp
		write_endpoint(local_ep, p);
	}
	else
	{
		write_uint8(1, p); // ATYP = IPv4
		write_uint32(0, p); // 0.0.0.0
		write_uint16(0, p); // :0
	}

	TORRENT_ASSERT_VAL(p - m_tmp_buf.data() < int(m_tmp_buf.size()), (p - m_tmp_buf.data()));
	ADD_OUTSTANDING_ASYNC("socks5::connect1");
	boost::asio::async_write(m_socks5_sock
		, boost::asio::buffer(m_tmp_buf.data(), aux::numeric_cast<std::size_t>(p - m_tmp_buf.data()))
		, std::bind(&socks5::connect1, self(), _1));
}